

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O3

int pkcs7_add_external_signature
              (CBB *out,X509 *sign_cert,EVP_PKEY *key,EVP_MD *md,BIO *data,bool use_key_id)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  X509 *local_1068;
  EVP_MD_CTX local_1060 [86];
  
  local_1068 = (X509 *)0x0;
  EVP_MD_CTX_init(local_1060);
  local_1068 = sign_cert;
  local_1060[0].pctx._0_1_ = use_key_id;
  iVar1 = EVP_DigestSignInit(local_1060,(EVP_PKEY_CTX **)0x0,(EVP_MD *)md,(ENGINE *)0x0,
                             (EVP_PKEY *)key);
  iVar3 = 0;
  if (iVar1 != 0) {
    do {
      uVar2 = BIO_read((BIO *)data,&local_1060[0].update,0x1000);
      iVar3 = 0;
      if ((int)uVar2 < 1) {
        if (uVar2 == 0) {
          iVar3 = pkcs7_add_signed_data
                            (out,(ulong)use_key_id * 2 + 1,write_signer_digest_algos,
                             (_func_int_CBB_ptr_void_ptr *)0x0,write_signer_info,&local_1068);
        }
        break;
      }
      iVar1 = EVP_DigestSignUpdate((EVP_MD_CTX *)local_1060,&local_1060[0].update,(ulong)uVar2);
    } while (iVar1 != 0);
  }
  EVP_MD_CTX_cleanup(local_1060);
  return iVar3;
}

Assistant:

int pkcs7_add_external_signature(CBB *out, X509 *sign_cert, EVP_PKEY *key,
                                 const EVP_MD *md, BIO *data, bool use_key_id) {
  signer_info_data si_data;
  si_data.use_key_id = use_key_id;
  si_data.sign_cert = sign_cert;

  // Set up the signature.
  if (!EVP_DigestSignInit(si_data.sign_ctx.get(), nullptr, md, nullptr, key) ||
      !digest_sign_update(si_data.sign_ctx.get(), data)) {
    return 0;
  }

  // See RFC 5652, Section 5.1. When no certificates are present, the version
  // comes from the highest SignerInfo version, which will be 3 (CMS) for a key
  // ID, and 1 (CMS or PKCS#7) for issuer and serial.
  uint64_t signed_data_version = use_key_id ? 3u : 1u;
  return pkcs7_add_signed_data(
      out, signed_data_version, write_signer_digest_algos,
      /*cert_crl_cb=*/nullptr, write_signer_info, &si_data);
}